

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse.h
# Opt level: O2

double mvm::num::parse_floating<double,8ul>(array<unsigned_char,_8UL> *bytes)

{
  unsigned_long uVar1;
  double dVar2;
  
  uVar1 = parse_unsigned<unsigned_long,std::array<unsigned_char,8ul>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>
                    ();
  dVar2 = std::ldexp<unsigned_long>
                    ((uVar1 & 0xfffffffffffff) + 0x10000000000000,
                     ((uint)(uVar1 >> 0x34) & 0x7ff) - 0x433);
  if ((long)uVar1 < 0) {
    dVar2 = -dVar2;
  }
  return dVar2;
}

Assistant:

auto parse_unsigned(std::array<uint8_t, N> const &bytes) {
  return parse_unsigned<T>(bytes, std::make_index_sequence<N>());
}